

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPSaveImage(WebPDecBuffer *buffer,WebPOutputFileFormat format,char *out_file_name)

{
  int iVar1;
  uint uVar2;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  WebPDecBuffer *unaff_retaddr;
  FILE *in_stack_00000008;
  int ok;
  int use_stdout;
  int needs_open_file;
  FILE *fout;
  WebPDecBuffer *in_stack_00000040;
  FILE *in_stack_00000048;
  WebPDecBuffer *in_stack_000000c0;
  FILE *in_stack_000000c8;
  WebPDecBuffer *in_stack_ffffffffffffffb8;
  FILE *in_stack_ffffffffffffffc0;
  byte local_35;
  uint local_34;
  int iVar3;
  FILE *__stream;
  uint local_4;
  
  __stream = (FILE *)0x0;
  iVar3 = 1;
  local_35 = 0;
  if (in_RDX != (char *)0x0) {
    iVar1 = strcmp(in_RDX,"-");
    local_35 = iVar1 != 0 ^ 0xff;
  }
  uVar2 = (uint)(local_35 & 1);
  local_34 = 1;
  if ((in_RDI == 0) || (in_RDX == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    if (iVar3 != 0) {
      if (uVar2 == 0) {
        in_stack_ffffffffffffffc0 = fopen(in_RDX,"wb");
      }
      else {
        in_stack_ffffffffffffffc0 = (FILE *)ImgIoUtilSetBinaryMode((FILE *)_stdout);
      }
      __stream = in_stack_ffffffffffffffc0;
      if (in_stack_ffffffffffffffc0 == (FILE *)0x0) {
        fprintf(stderr,"Error opening output file %s\n",in_RDX);
        return 0;
      }
    }
    if (((((in_ESI == 0) || (in_ESI == 9)) || (in_ESI == 0xb)) ||
        ((in_ESI == 0xc || (in_ESI == 0xf)))) || ((in_ESI == 0x10 || (in_ESI == 0x11)))) {
      local_34 = WebPWritePNG(in_stack_00000008,unaff_retaddr);
      local_34 = local_34 & 1;
    }
    else if (in_ESI == 1) {
      local_34 = WebPWritePAM((FILE *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_34 = local_34 & 1;
    }
    else if (((in_ESI == 2) || (in_ESI == 8)) || (in_ESI == 10)) {
      local_34 = WebPWritePPM((FILE *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_34 = local_34 & 1;
    }
    else if (((in_ESI == 0xd) || (in_ESI == 0xe)) || (in_ESI == 0x12)) {
      local_34 = WebPWrite16bAsPGM((FILE *)__stream,(WebPDecBuffer *)CONCAT44(iVar3,uVar2));
      local_34 = local_34 & 1;
    }
    else if (in_ESI == 4) {
      local_34 = WebPWriteBMP(in_stack_00000048,in_stack_00000040);
      local_34 = local_34 & 1;
    }
    else if (in_ESI == 5) {
      local_34 = WebPWriteTIFF(in_stack_000000c8,in_stack_000000c0);
      local_34 = local_34 & 1;
    }
    else if (in_ESI == 6) {
      local_34 = WebPWriteYUV(in_stack_00000008,unaff_retaddr);
      local_34 = local_34 & 1;
    }
    else if (((in_ESI == 3) || (in_ESI == 0x13)) || (in_ESI == 0x14)) {
      local_34 = WebPWritePGM(in_stack_00000008,unaff_retaddr);
      local_34 = local_34 & 1;
    }
    else if (in_ESI == 7) {
      local_34 = WebPWriteAlphaPlane((FILE *)__stream,(WebPDecBuffer *)CONCAT44(iVar3,uVar2));
      local_34 = local_34 & 1;
    }
    if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
      fclose(__stream);
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int WebPSaveImage(const WebPDecBuffer* const buffer,
                  WebPOutputFileFormat format,
                  const char* const out_file_name) {
  FILE* fout = NULL;
  int needs_open_file = 1;
  const int use_stdout =
      (out_file_name != NULL) && !WSTRCMP(out_file_name, "-");
  int ok = 1;

  if (buffer == NULL || out_file_name == NULL) return 0;

#ifdef HAVE_WINCODEC_H
  needs_open_file = (format != PNG);
#endif

  if (needs_open_file) {
    fout = use_stdout ? ImgIoUtilSetBinaryMode(stdout)
                      : WFOPEN(out_file_name, "wb");
    if (fout == NULL) {
      WFPRINTF(stderr, "Error opening output file %s\n",
               (const W_CHAR*)out_file_name);
      return 0;
    }
  }

  if (format == PNG ||
      format == RGBA || format == BGRA || format == ARGB ||
      format == rgbA || format == bgrA || format == Argb) {
#ifdef HAVE_WINCODEC_H
    ok &= WebPWritePNG(out_file_name, use_stdout, buffer);
#else
    ok &= WebPWritePNG(fout, buffer);
#endif
  } else if (format == PAM) {
    ok &= WebPWritePAM(fout, buffer);
  } else if (format == PPM || format == RGB || format == BGR) {
    ok &= WebPWritePPM(fout, buffer);
  } else if (format == RGBA_4444 || format == RGB_565 || format == rgbA_4444) {
    ok &= WebPWrite16bAsPGM(fout, buffer);
  } else if (format == BMP) {
    ok &= WebPWriteBMP(fout, buffer);
  } else if (format == TIFF) {
    ok &= WebPWriteTIFF(fout, buffer);
  } else if (format == RAW_YUV) {
    ok &= WebPWriteYUV(fout, buffer);
  } else if (format == PGM || format == YUV || format == YUVA) {
    ok &= WebPWritePGM(fout, buffer);
  } else if (format == ALPHA_PLANE_ONLY) {
    ok &= WebPWriteAlphaPlane(fout, buffer);
  }
  if (fout != NULL && fout != stdout) {
    fclose(fout);
  }
  return ok;
}